

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O0

Var Js::JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>
              (Var aValue,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  SideEffects SVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  JavascriptStringObject *this;
  JavascriptString *value;
  JavascriptNumberObject *this_00;
  JavascriptSymbolObject *this_01;
  ScriptContext *pSVar7;
  Var pvVar8;
  JavascriptDate *this_02;
  JavascriptTypedNumber<long> *this_03;
  JavascriptTypedNumber<unsigned_long> *this_04;
  double value_00;
  JavascriptDate *dateObject;
  ScriptContext *objectScriptContext_2;
  JavascriptSymbolObject *symbolObject;
  ScriptContext *objectScriptContext_1;
  JavascriptNumberObject *numberObject;
  ScriptContext *objectScriptContext;
  JavascriptStringObject *stringObject;
  ScriptContext *requestContext_local;
  Var aValue_local;
  TypeId local_18;
  TypeId typeId;
  
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(aValue);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aValue);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      pRVar6 = UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (pRVar6 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(pRVar6);
      if ((0x57 < (int)local_18) && (BVar4 = RecyclableObject::IsExternal(pRVar6), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
  }
  switch(local_18) {
  case TypeIds_Undefined:
  case TypeIds_Null:
  case TypeIds_Boolean:
  case TypeIds_FirstNumberType:
  case TypeIds_Number:
  case TypeIds_String:
  case TypeIds_Symbol:
  case TypeIds_BigInt:
    aValue_local = aValue;
    break;
  case TypeIds_Int64Number:
    this_03 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
    aValue_local = JavascriptTypedNumber<long>::ToJavascriptNumber(this_03);
    break;
  case TypeIds_LastNumberType:
    this_04 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
    aValue_local = JavascriptTypedNumber<unsigned_long>::ToJavascriptNumber(this_04);
    break;
  default:
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    aValue_local = MethodCallToPrimitive<(Js::JavascriptHint)2>(pRVar6,requestContext);
    break;
  case TypeIds_Date:
    this_02 = UnsafeVarTo<Js::JavascriptDate>(aValue);
    pSVar7 = RecyclableObject::GetScriptContext((RecyclableObject *)this_02);
    SVar3 = ScriptContextOptimizationOverrideInfo::GetSideEffects(&pSVar7->optimizationOverrides);
    if ((SVar3 & SideEffects_ValueOf) == SideEffects_None) {
      value_00 = JavascriptDate::GetTime(this_02);
      aValue_local = JavascriptNumber::ToVarNoCheck(value_00,requestContext);
    }
    else {
      aValue_local = MethodCallToPrimitive<(Js::JavascriptHint)2>
                               ((RecyclableObject *)this_02,requestContext);
    }
    break;
  case TypeIds_NumberObject:
    this_00 = UnsafeVarTo<Js::JavascriptNumberObject>(aValue);
    pSVar7 = RecyclableObject::GetScriptContext((RecyclableObject *)this_00);
    SVar3 = ScriptContextOptimizationOverrideInfo::GetSideEffects(&pSVar7->optimizationOverrides);
    if ((SVar3 & SideEffects_ValueOf) == SideEffects_None) {
      pvVar8 = JavascriptNumberObject::Unwrap(this_00);
      aValue_local = CrossSite::MarshalVar(requestContext,pvVar8,pSVar7);
    }
    else {
      aValue_local = MethodCallToPrimitive<(Js::JavascriptHint)2>
                               ((RecyclableObject *)this_00,requestContext);
    }
    break;
  case TypeIds_StringObject:
    this = UnsafeVarTo<Js::JavascriptStringObject>(aValue);
    pSVar7 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    SVar3 = ScriptContextOptimizationOverrideInfo::GetSideEffects(&pSVar7->optimizationOverrides);
    if ((SVar3 & SideEffects_ValueOf) == SideEffects_None) {
      value = JavascriptStringObject::Unwrap(this);
      aValue_local = CrossSite::MarshalVar(requestContext,value,pSVar7);
    }
    else {
      aValue_local = MethodCallToPrimitive<(Js::JavascriptHint)2>
                               ((RecyclableObject *)this,requestContext);
    }
    break;
  case TypeIds_SymbolObject:
    this_01 = UnsafeVarTo<Js::JavascriptSymbolObject>(aValue);
    pSVar7 = RecyclableObject::GetScriptContext((RecyclableObject *)this_01);
    SVar3 = ScriptContextOptimizationOverrideInfo::GetSideEffects(&pSVar7->optimizationOverrides);
    if ((SVar3 & SideEffects_ToPrimitive) == SideEffects_None) {
      pvVar8 = JavascriptSymbolObject::Unwrap(this_01);
      aValue_local = CrossSite::MarshalVar(requestContext,pvVar8,pSVar7);
    }
    else {
      aValue_local = MethodCallToPrimitive<(Js::JavascriptHint)2>
                               ((RecyclableObject *)this_01,requestContext);
    }
  }
  return aValue_local;
}

Assistant:

Var JavascriptConversion::ToPrimitive(_In_ Var aValue, _In_ ScriptContext * requestContext)
    {
        switch (JavascriptOperators::GetTypeId(aValue))
        {
        case TypeIds_Undefined:
        case TypeIds_Null:
        case TypeIds_Integer:
        case TypeIds_Boolean:
        case TypeIds_Number:
        case TypeIds_String:
        case TypeIds_Symbol:
        case TypeIds_BigInt:
            return aValue;

        case TypeIds_StringObject:
            {
                JavascriptStringObject * stringObject = UnsafeVarTo<JavascriptStringObject>(aValue);
                ScriptContext * objectScriptContext = stringObject->GetScriptContext();
                if (objectScriptContext->optimizationOverrides.GetSideEffects() & (hint == JavascriptHint::HintString ? SideEffects_ToString : SideEffects_ValueOf))
                {
                    return MethodCallToPrimitive<hint>(stringObject, requestContext);
                }

                return CrossSite::MarshalVar(requestContext, stringObject->Unwrap(), objectScriptContext);
            }

        case TypeIds_NumberObject:
            {
                JavascriptNumberObject * numberObject = UnsafeVarTo<JavascriptNumberObject>(aValue);
                ScriptContext * objectScriptContext = numberObject->GetScriptContext();
                if (hint == JavascriptHint::HintString)
                {
                    if (objectScriptContext->optimizationOverrides.GetSideEffects() & SideEffects_ToString)
                    {
                        return MethodCallToPrimitive<hint>(numberObject, requestContext);
                    }
                    return JavascriptNumber::ToStringRadix10(numberObject->GetValue(), requestContext);
                }
                else
                {
                    if (objectScriptContext->optimizationOverrides.GetSideEffects() & SideEffects_ValueOf)
                    {
                        return MethodCallToPrimitive<hint>(numberObject, requestContext);
                    }

                    return CrossSite::MarshalVar(requestContext, numberObject->Unwrap(), objectScriptContext);
                }
            }


        case TypeIds_SymbolObject:
            {
                JavascriptSymbolObject* symbolObject = UnsafeVarTo<JavascriptSymbolObject>(aValue);
                ScriptContext* objectScriptContext = symbolObject->GetScriptContext();
                if (objectScriptContext->optimizationOverrides.GetSideEffects() & SideEffects_ToPrimitive)
                {
                    return MethodCallToPrimitive<hint>(symbolObject, requestContext);
                }

                return CrossSite::MarshalVar(requestContext, symbolObject->Unwrap(), objectScriptContext);
            }

        case TypeIds_Date:
            {
                JavascriptDate* dateObject = UnsafeVarTo<JavascriptDate>(aValue);
                if(hint == JavascriptHint::HintNumber)
                {
                    if (dateObject->GetScriptContext()->optimizationOverrides.GetSideEffects() & SideEffects_ValueOf)
                    {
                        // if no Method exists this function falls back to OrdinaryToPrimitive
                        // if IsES6ToPrimitiveEnabled flag is off we also fall back to OrdinaryToPrimitive
                        return MethodCallToPrimitive<hint>(dateObject, requestContext);
                    }
                    return JavascriptNumber::ToVarNoCheck(dateObject->GetTime(), requestContext);
                }
                else
                {
                    if (dateObject->GetScriptContext()->optimizationOverrides.GetSideEffects() & SideEffects_ToString)
                    {
                        // if no Method exists this function falls back to OrdinaryToPrimitive
                        // if IsES6ToPrimitiveEnabled flag is off we also fall back to OrdinaryToPrimitive
                        return MethodCallToPrimitive<hint>(dateObject, requestContext);
                    }
                    return JavascriptDate::ToString(dateObject, requestContext);
                }
            }

        // convert to JavascriptNumber
        case TypeIds_Int64Number:
            return UnsafeVarTo<JavascriptInt64Number>(aValue)->ToJavascriptNumber();
        case TypeIds_UInt64Number:
            return UnsafeVarTo<JavascriptUInt64Number>(aValue)->ToJavascriptNumber();

        default:
            // if no Method exists this function falls back to OrdinaryToPrimitive
            // if IsES6ToPrimitiveEnabled flag is off we also fall back to OrdinaryToPrimitive
            return MethodCallToPrimitive<hint>(UnsafeVarTo<RecyclableObject>(aValue), requestContext);
        }
    }